

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O2

void __thiscall
xs::PosixTestProcess::start
          (PosixTestProcess *this,char *name,char *params,char *workingDir,char *caseList)

{
  string *__rhs;
  char cVar1;
  bool bVar2;
  deBool dVar3;
  Process *this_00;
  deUint64 dVar4;
  deFile *pdVar5;
  Error *this_01;
  TestProcessException *pTVar6;
  char *workingDirectory;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string cmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  FilePath local_90;
  FilePath logFilePath;
  FilePath local_50;
  
  if (this->m_process != (Process *)0x0) {
    this_01 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_01,(char *)0x0,"!m_process",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsPosixTestProcess.cpp"
                 ,0xbe);
    __cxa_throw(this_01,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = *caseList;
  local_d8 = caseList;
  de::FilePath::FilePath((FilePath *)&cmdLine,workingDir);
  de::FilePath::FilePath((FilePath *)&local_138,"TestResults.qpa");
  de::FilePath::join(&logFilePath,(FilePath *)&cmdLine,(FilePath *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&cmdLine);
  __rhs = &this->m_logFileName;
  std::__cxx11::string::assign((char *)__rhs);
  dVar3 = deFileExists((__rhs->_M_dataplus)._M_p);
  if (dVar3 != 0) {
    dVar3 = deDeleteFile((__rhs->_M_dataplus)._M_p);
    if (dVar3 != 0) {
      dVar3 = deFileExists((__rhs->_M_dataplus)._M_p);
      if (dVar3 == 0) goto LAB_0011595c;
    }
    pTVar6 = (TestProcessException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Failed to remove \'",(allocator<char> *)&local_90);
    std::operator+(&local_138,&local_d0,__rhs);
    std::operator+(&cmdLine,&local_138,"\'");
    TestProcessException::TestProcessException(pTVar6,&cmdLine);
    __cxa_throw(pTVar6,&TestProcessException::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0011595c:
  de::FilePath::FilePath((FilePath *)&local_138,name);
  bVar2 = de::FilePath::isAbsolutePath((FilePath *)&local_138);
  if (!bVar2) {
    de::FilePath::FilePath(&local_90,workingDir);
    de::FilePath::FilePath(&local_50,name);
    de::FilePath::join((FilePath *)&local_d0,&local_90,&local_50);
    name = local_d0._M_dataplus._M_p;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmdLine,name,(allocator<char> *)&local_f8);
  if (!bVar2) {
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8," --deqp-log-filename=",&local_139);
  de::FilePath::getBaseName_abi_cxx11_(&local_b0,&logFilePath);
  std::operator+(&local_138,&local_f8,&local_b0);
  std::__cxx11::string::append((string *)&cmdLine);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  if (cVar1 != '\0') {
    std::__cxx11::string::append((char *)&cmdLine);
  }
  if (*params != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8," ",(allocator<char> *)&local_b0);
    std::operator+(&local_138,&local_f8,params);
    std::__cxx11::string::append((string *)&cmdLine);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  this_00 = (Process *)operator_new(8);
  de::Process::Process(this_00);
  this->m_process = this_00;
  workingDirectory = (char *)0x0;
  if (*workingDir != '\0') {
    workingDirectory = workingDir;
  }
  de::Process::start(this_00,cmdLine._M_dataplus._M_p,workingDirectory);
  dVar4 = deGetMicroseconds();
  this->m_processStartTime = dVar4;
  pdVar5 = de::Process::getStdOut(this->m_process);
  if (pdVar5 != (deFile *)0x0) {
    pdVar5 = de::Process::getStdOut(this->m_process);
    posix::PipeReader::start(&this->m_stdOutReader,pdVar5);
  }
  pdVar5 = de::Process::getStdErr(this->m_process);
  if (pdVar5 != (deFile *)0x0) {
    pdVar5 = de::Process::getStdErr(this->m_process);
    posix::PipeReader::start(&this->m_stdErrReader,pdVar5);
  }
  if (cVar1 != '\0') {
    pdVar5 = de::Process::getStdIn(this->m_process);
    if (pdVar5 == (deFile *)0x0) {
      (*(this->super_TestProcess)._vptr_TestProcess[4])(this);
      pTVar6 = (TestProcessException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Failed to write case list",(allocator<char> *)&local_f8);
      TestProcessException::TestProcessException(pTVar6,&local_138);
      __cxa_throw(pTVar6,&TestProcessException::typeinfo,std::runtime_error::~runtime_error);
    }
    posix::CaseListWriter::start(&this->m_caseListWriter,local_d8,pdVar5);
  }
  std::__cxx11::string::~string((string *)&cmdLine);
  std::__cxx11::string::~string((string *)&logFilePath);
  return;
}

Assistant:

void PosixTestProcess::start (const char* name, const char* params, const char* workingDir, const char* caseList)
{
	bool hasCaseList = strlen(caseList) > 0;

	XS_CHECK(!m_process);

	de::FilePath logFilePath = de::FilePath::join(workingDir, "TestResults.qpa");
	m_logFileName = logFilePath.getPath();

	// Remove old file if such exists.
	if (deFileExists(m_logFileName.c_str()))
	{
		if (!deDeleteFile(m_logFileName.c_str()) || deFileExists(m_logFileName.c_str()))
			throw TestProcessException(string("Failed to remove '") + m_logFileName + "'");
	}

	// Construct command line.
	string cmdLine = de::FilePath(name).isAbsolutePath() ? name : de::FilePath::join(workingDir, name).getPath();
	cmdLine += string(" --deqp-log-filename=") + logFilePath.getBaseName();

	if (hasCaseList)
		cmdLine += " --deqp-stdin-caselist";

	if (strlen(params) > 0)
		cmdLine += string(" ") + params;

	DE_ASSERT(!m_process);
	m_process = new de::Process();

	try
	{
		m_process->start(cmdLine.c_str(), strlen(workingDir) > 0 ? workingDir : DE_NULL);
	}
	catch (const de::ProcessError& e)
	{
		delete m_process;
		m_process = DE_NULL;
		throw TestProcessException(e.what());
	}

	m_processStartTime = deGetMicroseconds();

	// Create stdout & stderr readers.
	if (m_process->getStdOut())
		m_stdOutReader.start(m_process->getStdOut());

	if (m_process->getStdErr())
		m_stdErrReader.start(m_process->getStdErr());

	// Start case list writer.
	if (hasCaseList)
	{
		deFile* dst = m_process->getStdIn();
		if (dst)
			m_caseListWriter.start(caseList, dst);
		else
		{
			cleanup();
			throw TestProcessException("Failed to write case list");
		}
	}
}